

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.c
# Opt level: O0

char * err_set_loglevel_str(char *lvl)

{
  char *pcVar1;
  int iVar2;
  err_lvl_t local_24;
  int i;
  char *rv;
  char *lvl_local;
  
  pcVar1 = err_level[min_loglevel];
  if (lvl != (char *)0x0) {
    iVar2 = strncmp(lvl,"ERR_",4);
    rv = lvl;
    if (iVar2 == 0) {
      rv = lvl + 4;
    }
    for (local_24 = ERR_DEBUG; (int)local_24 < 5; local_24 = local_24 + ERR_INFO) {
      iVar2 = strcmp(rv,err_level[(int)local_24]);
      if (iVar2 == 0) {
        min_loglevel = local_24;
        return pcVar1;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

const char *
err_set_loglevel_str(char const *lvl)
{
    const char *rv = err_level[min_loglevel];
    int i;

    if (lvl == NULL)
        return NULL;
    if (!strncmp(lvl, "ERR_", 4))
        lvl += 4;
    for (i = 0; i < ERR_MAX; ++i) {
        if (!strcmp(lvl, err_level[i])) {
            min_loglevel = i;
            return rv;
        }
    }
    return NULL;
}